

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O2

lzma_ret block_buffer_encode(lzma_block *block,lzma_allocator *allocator,uint8_t *in,size_t in_size,
                            uint8_t *out,size_t *out_pos,size_t out_size,_Bool try_to_compress)

{
  lzma_check type;
  size_t sVar1;
  lzma_filter *plVar2;
  lzma_bool lVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  lzma_ret lVar6;
  uint64_t uVar7;
  ulong uVar8;
  long lVar9;
  ulong __n;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  lzma_next_coder raw_encoder;
  lzma_filter local_58;
  undefined8 local_48;
  
  if (block == (lzma_block *)0x0) {
    return LZMA_PROG_ERROR;
  }
  if ((out_pos == (size_t *)0x0 || out == (uint8_t *)0x0) || in_size != 0 && in == (uint8_t *)0x0) {
    return LZMA_PROG_ERROR;
  }
  uVar13 = *out_pos;
  if (out_size < uVar13) {
    return LZMA_PROG_ERROR;
  }
  if (1 < block->version) {
    return LZMA_OPTIONS_ERROR;
  }
  type = block->check;
  if (0xf < type) {
    return LZMA_PROG_ERROR;
  }
  if ((try_to_compress) && (block->filters == (lzma_filter *)0x0)) {
    return LZMA_PROG_ERROR;
  }
  lVar3 = lzma_check_is_supported(type);
  if (lVar3 == '\0') {
    return LZMA_UNSUPPORTED_CHECK;
  }
  uVar5 = lzma_check_size(type);
  if (uVar5 == 0xffffffff) {
    __assert_fail("check_size != UINT32_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                  ,0xfd,
                  "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                 );
  }
  lVar9 = out_size - ((int)out_size - (int)uVar13 & 3);
  __n = (ulong)uVar5;
  if (lVar9 - uVar13 <= __n) {
    return LZMA_BUF_ERROR;
  }
  block->uncompressed_size = in_size;
  uVar7 = lzma2_bound(in_size);
  block->compressed_size = uVar7;
  if (uVar7 == 0) {
    return LZMA_DATA_ERROR;
  }
  uVar13 = lVar9 - __n;
  if (try_to_compress) {
    lVar6 = lzma_block_header_size(block);
    if (lVar6 == LZMA_OK) {
      sVar1 = *out_pos;
      if (uVar13 - sVar1 <= (ulong)block->header_size) goto LAB_0019abe3;
      sVar10 = block->header_size + sVar1;
      *out_pos = sVar10;
      uVar8 = block->compressed_size;
      raw_encoder.coder = (void *)0x0;
      raw_encoder.get_check = (_func_lzma_check_void_ptr *)0x0;
      raw_encoder.memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
      raw_encoder.end = (lzma_end_function)0x0;
      raw_encoder.get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
      raw_encoder.init = 0;
      raw_encoder.code = (lzma_code_function)0x0;
      raw_encoder.update =
           (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
      raw_encoder.id = 0xffffffffffffffff;
      lVar6 = lzma_raw_encoder_init(&raw_encoder,allocator,block->filters);
      if (lVar6 == LZMA_OK) {
        sVar11 = sVar10 + uVar8;
        if (uVar13 - sVar10 <= uVar8) {
          sVar11 = uVar13;
        }
        local_58.id = 0;
        lVar6 = (*raw_encoder.code)(raw_encoder.coder,allocator,in,&local_58.id,in_size,out,out_pos,
                                    sVar11,LZMA_FINISH);
      }
      lzma_next_end(&raw_encoder,allocator);
      if (lVar6 == LZMA_OK) {
        lVar6 = LZMA_BUF_ERROR;
      }
      else if (lVar6 == LZMA_STREAM_END) {
        block->compressed_size = *out_pos - (block->header_size + sVar1);
        lVar6 = lzma_block_header_encode(block,out + sVar1);
        if (lVar6 == LZMA_OK) {
          lVar6 = LZMA_OK;
          goto LAB_0019abc2;
        }
        lVar6 = LZMA_PROG_ERROR;
      }
      *out_pos = sVar1;
    }
LAB_0019abc2:
    if (lVar6 == LZMA_BUF_ERROR) goto LAB_0019abe3;
    if (lVar6 != LZMA_OK) {
      return lVar6;
    }
    uVar8 = *out_pos;
LAB_0019ad25:
    if (uVar13 < uVar8) {
      __assert_fail("*out_pos <= out_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                    ,0x121,
                    "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                   );
    }
    for (uVar8 = block->compressed_size; (uVar8 & 3) != 0; uVar8 = uVar8 + 1) {
      uVar12 = *out_pos;
      if (uVar13 <= uVar12) {
        __assert_fail("*out_pos < out_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                      ,0x127,
                      "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                     );
      }
      *out_pos = uVar12 + 1;
      out[uVar12] = '\0';
    }
    lVar6 = LZMA_OK;
    if (__n != 0) {
      lzma_check_init((lzma_check_state *)&raw_encoder,block->check);
      lzma_check_update((lzma_check_state *)&raw_encoder,block->check,in,in_size);
      lzma_check_finish((lzma_check_state *)&raw_encoder,block->check);
      memcpy(block->raw_check,(lzma_check_state *)&raw_encoder,__n);
      memcpy(out + *out_pos,(lzma_check_state *)&raw_encoder,__n);
      *out_pos = *out_pos + __n;
    }
  }
  else {
LAB_0019abe3:
    local_58.options = &raw_encoder;
    raw_encoder.id = 0;
    raw_encoder.update =
         (_func_lzma_ret_void_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr *)0x0;
    raw_encoder.get_check = (_func_lzma_check_void_ptr *)0x0;
    raw_encoder.memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
    raw_encoder.end = (lzma_end_function)0x0;
    raw_encoder.get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
    local_58.id = 0x21;
    local_48 = 0xffffffffffffffff;
    raw_encoder.init = 0;
    raw_encoder.code = (lzma_code_function)0x0;
    raw_encoder.coder = (void *)0x1000;
    plVar2 = block->filters;
    block->filters = &local_58;
    lVar6 = lzma_block_header_size(block);
    if (lVar6 == LZMA_OK) {
      if (block->compressed_size != uVar7) {
        __assert_fail("block->compressed_size == lzma2_bound(in_size)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                      ,0x77,
                      "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                     );
      }
      if (uVar7 + block->header_size <= uVar13 - *out_pos) {
        lVar6 = lzma_block_header_encode(block,out + *out_pos);
        block->filters = plVar2;
        if (lVar6 != LZMA_OK) {
          return LZMA_PROG_ERROR;
        }
        uVar12 = (ulong)block->header_size;
        uVar4 = '\x01';
        uVar8 = 0;
        while( true ) {
          lVar9 = *out_pos + uVar12;
          *out_pos = *out_pos + uVar12 + 1;
          uVar12 = in_size - uVar8;
          if (in_size < uVar8 || uVar12 == 0) break;
          out[lVar9] = uVar4;
          if (0xffff < uVar12) {
            uVar12 = 0x10000;
          }
          sVar1 = *out_pos;
          *out_pos = sVar1 + 1;
          out[sVar1] = (uint8_t)(uVar12 - 1 >> 8);
          sVar1 = *out_pos;
          *out_pos = sVar1 + 1;
          out[sVar1] = (uint8_t)(uVar12 - 1);
          if (uVar13 < *out_pos + uVar12) {
            __assert_fail("*out_pos + copy_size <= out_size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                          ,0x97,
                          "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                         );
          }
          memcpy(out + *out_pos,in + uVar8,uVar12);
          uVar8 = uVar8 + uVar12;
          uVar4 = '\x02';
        }
        out[lVar9] = '\0';
        uVar8 = *out_pos;
        if (uVar13 < uVar8) {
          __assert_fail("*out_pos <= out_size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                        ,0xa0,
                        "lzma_ret block_encode_uncompressed(lzma_block *, const uint8_t *, size_t, uint8_t *, size_t *, size_t)"
                       );
        }
        goto LAB_0019ad25;
      }
      lVar6 = LZMA_BUF_ERROR;
    }
    else {
      lVar6 = LZMA_PROG_ERROR;
    }
    block->filters = plVar2;
  }
  return lVar6;
}

Assistant:

static lzma_ret
block_buffer_encode(lzma_block *block, const lzma_allocator *allocator,
		const uint8_t *in, size_t in_size,
		uint8_t *out, size_t *out_pos, size_t out_size,
		bool try_to_compress)
{
	// Validate the arguments.
	if (block == NULL || (in == NULL && in_size != 0) || out == NULL
			|| out_pos == NULL || *out_pos > out_size)
		return LZMA_PROG_ERROR;

	// The contents of the structure may depend on the version so
	// check the version before validating the contents of *block.
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	if ((unsigned int)(block->check) > LZMA_CHECK_ID_MAX
			|| (try_to_compress && block->filters == NULL))
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(block->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Size of a Block has to be a multiple of four, so limit the size
	// here already. This way we don't need to check it again when adding
	// Block Padding.
	out_size -= (out_size - *out_pos) & 3;

	// Get the size of the Check field.
	const size_t check_size = lzma_check_size(block->check);
	assert(check_size != UINT32_MAX);

	// Reserve space for the Check field.
	if (out_size - *out_pos <= check_size)
		return LZMA_BUF_ERROR;

	out_size -= check_size;

	// Initialize block->uncompressed_size and calculate the worst-case
	// value for block->compressed_size.
	block->uncompressed_size = in_size;
	block->compressed_size = lzma2_bound(in_size);
	if (block->compressed_size == 0)
		return LZMA_DATA_ERROR;

	// Do the actual compression.
	lzma_ret ret = LZMA_BUF_ERROR;
	if (try_to_compress)
		ret = block_encode_normal(block, allocator,
				in, in_size, out, out_pos, out_size);

	if (ret != LZMA_OK) {
		// If the error was something else than output buffer
		// becoming full, return the error now.
		if (ret != LZMA_BUF_ERROR)
			return ret;

		// The data was uncompressible (at least with the options
		// given to us) or the output buffer was too small. Use the
		// uncompressed chunks of LZMA2 to wrap the data into a valid
		// Block. If we haven't been given enough output space, even
		// this may fail.
		return_if_error(block_encode_uncompressed(block, in, in_size,
				out, out_pos, out_size));
	}

	assert(*out_pos <= out_size);

	// Block Padding. No buffer overflow here, because we already adjusted
	// out_size so that (out_size - out_start) is a multiple of four.
	// Thus, if the buffer is full, the loop body can never run.
	for (size_t i = (size_t)(block->compressed_size); i & 3; ++i) {
		assert(*out_pos < out_size);
		out[(*out_pos)++] = 0x00;
	}

	// If there's no Check field, we are done now.
	if (check_size > 0) {
		// Calculate the integrity check. We reserved space for
		// the Check field earlier so we don't need to check for
		// available output space here.
		lzma_check_state check;
		lzma_check_init(&check, block->check);
		lzma_check_update(&check, block->check, in, in_size);
		lzma_check_finish(&check, block->check);

		memcpy(block->raw_check, check.buffer.u8, check_size);
		memcpy(out + *out_pos, check.buffer.u8, check_size);
		*out_pos += check_size;
	}

	return LZMA_OK;
}